

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPFile
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,gcstring *ZipFileName)

{
  ExceptionReporter<GenICam_3_4::RuntimeException> *this_00;
  gcstring *DeviceName;
  INodeMap *pNodeMap_00;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this_01;
  undefined8 in_RSI;
  long in_RDI;
  INodeMap *pNodeMap;
  CNodeMapFactory nodeMapData;
  int *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  int SourceLine;
  char *in_stack_fffffffffffffeb8;
  gcstring local_130 [80];
  gcstring *local_e0;
  CNodeMapFactory local_d8 [19];
  undefined1 local_c5;
  char local_b8 [184];
  
  SourceLine = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  if (*(long *)(in_RDI + 8) != 0) {
    local_c5 = 1;
    this_00 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
              (this_00,in_stack_fffffffffffffeb8,SourceLine,in_stack_fffffffffffffea8);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
              (this_00,local_b8,"Node map already created");
    local_c5 = 0;
    __cxa_throw(this_00,&GenICam_3_4::RuntimeException::typeinfo,
                GenICam_3_4::RuntimeException::~RuntimeException);
  }
  GenApi_3_4::CNodeMapFactory::CNodeMapFactory(local_d8,1,in_RSI,0);
  GenICam_3_4::gcstring::gcstring(local_130,"Device");
  DeviceName = (gcstring *)
               GenApi_3_4::CNodeMapFactory::CreateNodeMap((gcstring *)local_d8,SUB81(local_130,0));
  GenICam_3_4::gcstring::~gcstring(local_130);
  pNodeMap_00 = (INodeMap *)(in_RDI + 0x10);
  local_e0 = DeviceName;
  this_01 = (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)operator_new(4);
  *(undefined4 *)&(this_01->super_CGeneric_XMLLoaderParams)._vptr_CGeneric_XMLLoaderParams = 0;
  Attach(this_01,pNodeMap_00,DeviceName,in_stack_fffffffffffffe98);
  GenApi_3_4::CNodeMapFactory::~CNodeMapFactory(local_d8);
  return;
}

Assistant:

inline void CNodeMapRefT<TCameraParams>::_LoadXMLFromZIPFile(const GENICAM_NAMESPACE::gcstring &ZipFileName)
    {
        // FileName environment is replaced in CNodeMapFactory ctor

        // Load the DLL
        if(_Ptr)
            throw RUNTIME_EXCEPTION("Node map already created");

        // Load the XML file
        CNodeMapFactory nodeMapData(ContentType_ZippedXml, ZipFileName);

        // First create node map then the reference counter. This prevents a leak in case of bad node map
        INodeMap* pNodeMap = nodeMapData.CreateNodeMap();
        Attach( pNodeMap, _DeviceName, new int(0));
    }